

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Marshall.c
# Opt level: O0

WJTL_STATUS TestMarshallStrings(void)

{
  WJTL_STATUS WVar1;
  JL_STATUS JVar2;
  _Bool _result_7;
  _Bool _result_6;
  _Bool _result_5;
  _Bool _result_4;
  _Bool _result_3;
  _Bool _result_2;
  _Bool _result_1;
  _Bool _result;
  char *jsonString;
  StringStruct theStruct;
  JlMarshallElement marshalStringStruct [2];
  WJTL_STATUS local_c;
  WJTL_STATUS TestReturn;
  
  local_c = WJTL_STATUS_SUCCESS;
  memcpy(&theStruct.strPtr,&DAT_0014f8f0,0xc0);
  memset(&jsonString,0,0x18);
  __result_7 = (char *)0x0;
  WVar1 = MakeJsonAndVerify(&jsonString,(JlMarshallElement *)&theStruct.strPtr,2,
                            "{\"fixedStr\":null,\"strPtr\":null}");
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(MakeJsonAndVerify( &theStruct, marshalStringStruct, ( sizeof(marshalStringStruct) / sizeof((marshalStringStruct)[0]) ), \"{\\\"fixedStr\\\":null,\\\"strPtr\\\":null}\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Marshall.c"
                   ,"TestMarshallStrings",0x7b);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    local_c = WJTL_STATUS_FAILED;
  }
  strcpy((char *)&jsonString,"Hello");
  theStruct._8_8_ = anon_var_dwarf_e0d0;
  WVar1 = MakeJsonAndVerify(&jsonString,(JlMarshallElement *)&theStruct.strPtr,2,
                            "{\"fixedStr\":\"Hello\",\"strPtr\":\"There\"}");
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(MakeJsonAndVerify( &theStruct, marshalStringStruct, ( sizeof(marshalStringStruct) / sizeof((marshalStringStruct)[0]) ), \"{\\\"fixedStr\\\":\\\"Hello\\\",\\\"strPtr\\\":\\\"There\\\"}\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Marshall.c"
                   ,"TestMarshallStrings",0x81);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    local_c = WJTL_STATUS_FAILED;
  }
  jsonString._0_1_ = 0;
  theStruct._8_8_ = anon_var_dwarf_e106;
  WVar1 = MakeJsonAndVerify(&jsonString,(JlMarshallElement *)&theStruct.strPtr,2,
                            "{\"fixedStr\":null,\"strPtr\":\"\\u0001\\u0002\\u0003\\u0004\\u0005\\u0006\\u0007\\b\\t\\n\\u000b\\f\\r\\u000e\"}"
                           );
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(MakeJsonAndVerify( &theStruct, marshalStringStruct, ( sizeof(marshalStringStruct) / sizeof((marshalStringStruct)[0]) ), \"{\\\"fixedStr\\\":null,\\\"strPtr\\\":\\\"\\\\u0001\\\\u0002\\\\u0003\\\\u0004\\\\u0005\\\\u0006\\\\u0007\\\\b\\\\t\\\\n\\\\u000b\\\\f\\\\r\\\\u000e\\\"}\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Marshall.c"
                   ,"TestMarshallStrings",0x87);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    local_c = WJTL_STATUS_FAILED;
  }
  theStruct._8_8_ = anon_var_dwarf_e149;
  WVar1 = MakeJsonAndVerify(&jsonString,(JlMarshallElement *)&theStruct.strPtr,2,
                            "{\"fixedStr\":null,\"strPtr\":\"\\u0010\\u0011\\u0012\\u0013\\u0014\\u0015\\u0016\\u0017\\u0018\\u0019\\u001a\\u001b\\u001c\\u001d\\u001e\\u001f\"}"
                           );
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(MakeJsonAndVerify( &theStruct, marshalStringStruct, ( sizeof(marshalStringStruct) / sizeof((marshalStringStruct)[0]) ), \"{\\\"fixedStr\\\":null,\\\"strPtr\\\":\\\"\\\\u0010\\\\u0011\\\\u0012\\\\u0013\\\\u0014\\\\u0015\\\\u0016\\\\u0017\" \"\\\\u0018\\\\u0019\\\\u001a\\\\u001b\\\\u001c\\\\u001d\\\\u001e\\\\u001f\\\"}\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Marshall.c"
                   ,"TestMarshallStrings",0x8c);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    local_c = WJTL_STATUS_FAILED;
  }
  theStruct._8_8_ = anon_var_dwarf_585c;
  WVar1 = MakeJsonAndVerify(&jsonString,(JlMarshallElement *)&theStruct.strPtr,2,
                            "{\"fixedStr\":null,\"strPtr\":\"_\\\"_\"}");
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(MakeJsonAndVerify( &theStruct, marshalStringStruct, ( sizeof(marshalStringStruct) / sizeof((marshalStringStruct)[0]) ), \"{\\\"fixedStr\\\":null,\\\"strPtr\\\":\\\"_\\\\\\\"_\\\"}\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Marshall.c"
                   ,"TestMarshallStrings",0x90);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    local_c = WJTL_STATUS_FAILED;
  }
  theStruct._8_8_ = anon_var_dwarf_587d;
  WVar1 = MakeJsonAndVerify(&jsonString,(JlMarshallElement *)&theStruct.strPtr,2,
                            "{\"fixedStr\":null,\"strPtr\":\"_\\\\_\"}");
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(MakeJsonAndVerify( &theStruct, marshalStringStruct, ( sizeof(marshalStringStruct) / sizeof((marshalStringStruct)[0]) ), \"{\\\"fixedStr\\\":null,\\\"strPtr\\\":\\\"_\\\\\\\\_\\\"}\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Marshall.c"
                   ,"TestMarshallStrings",0x94);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    local_c = WJTL_STATUS_FAILED;
  }
  theStruct._8_8_ = anon_var_dwarf_445;
  WVar1 = MakeJsonAndVerify(&jsonString,(JlMarshallElement *)&theStruct.strPtr,2,anon_var_dwarf_e202
                           );
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(MakeJsonAndVerify( &theStruct, marshalStringStruct, ( sizeof(marshalStringStruct) / sizeof((marshalStringStruct)[0]) ), \"{\\\"fixedStr\\\":null,\\\"strPtr\\\":\\\"\\xF0\\x9F\\x98\\x81\\\"}\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Marshall.c"
                   ,"TestMarshallStrings",0x98);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    local_c = WJTL_STATUS_FAILED;
  }
  theStruct._8_8_ = anon_var_dwarf_58cb;
  JVar2 = JlStructToJson(&jsonString,(JlMarshallElement *)&theStruct.strPtr,2,false,
                         (char **)&_result_7);
  WjTestLib_Assert(JVar2 == JL_STATUS_INVALID_DATA,
                   "(JlStructToJson( &theStruct, marshalStringStruct, ( sizeof(marshalStringStruct) / sizeof((marshalStringStruct)[0]) ), 0, &jsonString )) == (JL_STATUS_INVALID_DATA)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Marshall.c"
                   ,"TestMarshallStrings",0x9d);
  if (JVar2 != JL_STATUS_INVALID_DATA) {
    local_c = WJTL_STATUS_FAILED;
  }
  return local_c;
}

Assistant:

static
WJTL_STATUS
    TestMarshallStrings
    (
        void
    )
{
    WJTL_STATUS TestReturn = WJTL_STATUS_SUCCESS;

    typedef struct
    {
        char fixedStr[10];
        char* strPtr;
    } StringStruct;

    JlMarshallElement marshalStringStruct[] =
    {
        JlMarshallStringFixed( StringStruct, fixedStr, "fixedStr" ),
        JlMarshallString( StringStruct, strPtr, "strPtr" ),
    };

    StringStruct theStruct = {{0}};
    char* jsonString = NULL;

    // Check marshalling null strings
    JL_ASSERT_SUCCESS( MakeJsonAndVerify( &theStruct, marshalStringStruct, NumElements(marshalStringStruct),
                                          "{\"fixedStr\":null,\"strPtr\":null}" ) );

    // Check with strings
    strcpy( theStruct.fixedStr, "Hello" );
    theStruct.strPtr = "There";
    JL_ASSERT_SUCCESS( MakeJsonAndVerify( &theStruct, marshalStringStruct, NumElements(marshalStringStruct),
                                          "{\"fixedStr\":\"Hello\",\"strPtr\":\"There\"}" ) );

    // try with escaped characters
    theStruct.fixedStr[0] = 0;
    theStruct.strPtr = "\x01\x02\x03\x04\x05\x06\x07\x08\x09\x0a\x0b\x0c\x0d\x0e\0xf";
    JL_ASSERT_SUCCESS( MakeJsonAndVerify( &theStruct, marshalStringStruct, NumElements(marshalStringStruct),
        "{\"fixedStr\":null,\"strPtr\":\"\\u0001\\u0002\\u0003\\u0004\\u0005\\u0006\\u0007\\b\\t\\n\\u000b\\f\\r\\u000e\"}" ) );

    theStruct.strPtr = "\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1a\x1b\x1c\x1d\x1e\x1f";
    JL_ASSERT_SUCCESS( MakeJsonAndVerify( &theStruct, marshalStringStruct, NumElements(marshalStringStruct),
        "{\"fixedStr\":null,\"strPtr\":\"\\u0010\\u0011\\u0012\\u0013\\u0014\\u0015\\u0016\\u0017"
        "\\u0018\\u0019\\u001a\\u001b\\u001c\\u001d\\u001e\\u001f\"}" ) );

    theStruct.strPtr = "_\"_";
    JL_ASSERT_SUCCESS( MakeJsonAndVerify( &theStruct, marshalStringStruct, NumElements(marshalStringStruct),
                       "{\"fixedStr\":null,\"strPtr\":\"_\\\"_\"}" ) );

    theStruct.strPtr = "_\\_";
    JL_ASSERT_SUCCESS( MakeJsonAndVerify( &theStruct, marshalStringStruct, NumElements(marshalStringStruct),
                                          "{\"fixedStr\":null,\"strPtr\":\"_\\\\_\"}" ) );

    theStruct.strPtr = "\xF0\x9F\x98\x81";       // smiley face emoji
    JL_ASSERT_SUCCESS( MakeJsonAndVerify( &theStruct, marshalStringStruct, NumElements(marshalStringStruct),
                                          "{\"fixedStr\":null,\"strPtr\":\"\xF0\x9F\x98\x81\"}" ) );

    // Test invalid utf8 values (truncated)
    theStruct.strPtr = "\xF0\x9F\x98Truncated";
    JL_ASSERT_STATUS( JlStructToJson( &theStruct, marshalStringStruct, NumElements(marshalStringStruct), false, &jsonString ),
                      JL_STATUS_INVALID_DATA );

    return TestReturn;
}